

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

void google::protobuf::compiler::cpp::anon_unknown_0::Flatten
               (Descriptor *descriptor,
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *flatten)

{
  int i;
  long lVar1;
  long lVar2;
  Descriptor *local_28;
  
  lVar2 = 0;
  local_28 = descriptor;
  for (lVar1 = 0; lVar1 < *(int *)(descriptor + 0x70); lVar1 = lVar1 + 1) {
    Flatten((Descriptor *)(*(long *)(descriptor + 0x38) + lVar2),flatten);
    lVar2 = lVar2 + 0x90;
  }
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::push_back(flatten,&local_28);
  return;
}

Assistant:

void Flatten(const Descriptor* descriptor,
             std::vector<const Descriptor*>* flatten) {
  for (int i = 0; i < descriptor->nested_type_count(); i++)
    Flatten(descriptor->nested_type(i), flatten);
  flatten->push_back(descriptor);
}